

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

void startElementTokenizer(void *ctx,xmlChar *name,xmlChar **atts)

{
  long lVar1;
  xmlChar *pxVar2;
  xmlChar **ppxVar3;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if (*(int *)(lVar1 + 4) != 0) {
    fputc(10,(FILE *)SAXdebug);
    *(undefined4 *)(lVar1 + 4) = 0;
  }
  fprintf((FILE *)SAXdebug,"StartTag\n%s",name);
  if ((atts != (xmlChar **)0x0) && (*atts != (xmlChar *)0x0)) {
    ppxVar3 = atts + 2;
    do {
      fprintf((FILE *)SAXdebug," %s=");
      if (ppxVar3[-1] != (xmlChar *)0x0) {
        fputs((char *)ppxVar3[-1],(FILE *)SAXdebug);
      }
      pxVar2 = *ppxVar3;
      ppxVar3 = ppxVar3 + 2;
    } while (pxVar2 != (xmlChar *)0x0);
  }
  fputc(10,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
startElementTokenizer(void *ctx, const xmlChar *name, const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;
    int i;

    pendingTokenizer(config);

    fprintf(SAXdebug, "StartTag\n%s", name);
    if (atts != NULL) {
        for (i = 0; atts[i] != NULL; i += 2) {
	    fprintf(SAXdebug, " %s=", atts[i]);
            if (atts[i+1] != NULL)
	        fprintf(SAXdebug, "%s", atts[i+1]);
        }
    }
    fprintf(SAXdebug, "\n");
}